

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Glucose::Solver::detachClausePurgatory(Solver *this,CRef cr,bool strict)

{
  Lit LVar1;
  byte in_DL;
  CRef in_ESI;
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
  *in_RDI;
  Clause *c;
  Ref in_stack_ffffffffffffff9c;
  ClauseAllocator *in_stack_ffffffffffffffa0;
  Watcher *t;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  Lit *in_stack_ffffffffffffffb8;
  Watcher local_28;
  int local_20;
  int local_1c;
  Clause *local_18;
  byte local_d;
  CRef local_c;
  
  local_d = in_DL & 1;
  local_c = in_ESI;
  local_18 = ClauseAllocator::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  if ((local_d & 1) == 0) {
    LVar1 = Clause::operator[](local_18,0);
    operator~(LVar1);
    OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
    ::smudge(in_RDI,in_stack_ffffffffffffffb8);
  }
  else {
    t = (Watcher *)&in_RDI[8].dirty;
    local_20 = (int)Clause::operator[](local_18,0);
    local_1c = (int)operator~((Lit)local_20);
    OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
    ::operator[]((OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
                  *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),(Lit *)t);
    LVar1 = Clause::operator[](local_18,1);
    Watcher::Watcher(&local_28,local_c,LVar1);
    remove<Glucose::vec<Glucose::Solver::Watcher>,Glucose::Solver::Watcher>
              ((vec<Glucose::Solver::Watcher> *)CONCAT44(local_c,in_stack_ffffffffffffffb0),t);
  }
  return;
}

Assistant:

void Solver::detachClausePurgatory(CRef cr, bool strict) {
    const Clause &c = ca[cr];

    assert(c.size() > 1);
    if(strict)
        remove(unaryWatches[~c[0]], Watcher(cr, c[1]));
    else
        unaryWatches.smudge(~c[0]);
}